

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall psy::C::Parser::Parser(Parser *this,SyntaxTree *tree)

{
  MemoryPool *pMVar1;
  
  pMVar1 = SyntaxTree::unitPool(tree);
  this->pool_ = pMVar1;
  this->tree_ = tree;
  this->backtracker_ = (Backtracker *)0x0;
  DiagnosticsReporter::DiagnosticsReporter(&this->diagReporter_,this);
  this->curTkIdx_ = 1;
  this->isWithinKandRFuncDef_ = false;
  this->DEPTH_OF_EXPRS_ = 0;
  this->DEPTH_OF_STMTS_ = 0;
  return;
}

Assistant:

Parser::Parser(SyntaxTree* tree)
    : pool_(tree->unitPool())
    , tree_(tree)
    , backtracker_(nullptr)
    , diagReporter_(this)
    , curTkIdx_(1)
    , isWithinKandRFuncDef_(false)
    , DEPTH_OF_EXPRS_(0)
    , DEPTH_OF_STMTS_(0)
{
    depth_ = 0;
}